

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclDnsize.c
# Opt level: O1

int Abc_SclCheckImprovement
              (SC_Man *p,Abc_Obj_t *pObj,Vec_Int_t *vNodes,Vec_Int_t *vEvals,int Notches,
              int DelayGap)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  undefined4 uVar4;
  Vec_Int_t *pVVar5;
  void *pvVar6;
  Vec_Ptr_t *pVVar7;
  Vec_Flt_t *pVVar8;
  Abc_Ntk_t *pAVar9;
  void **ppvVar10;
  SC_Pair *pSVar11;
  long *plVar12;
  long lVar13;
  int iVar14;
  float *pfVar15;
  uint uVar16;
  long lVar17;
  int *extraout_RDX;
  int *piVar18;
  uint uVar19;
  ulong uVar20;
  SC_Cell *pSVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  timespec ts;
  float local_70;
  uint local_6c;
  SC_Cell *local_68;
  long local_48;
  timespec local_40;
  
  iVar14 = clock_gettime(3,&local_40);
  if (iVar14 < 0) {
    local_48 = 1;
  }
  else {
    lVar17 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    local_48 = ((lVar17 >> 7) - (lVar17 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  iVar14 = pObj->Id;
  if ((long)iVar14 < 0) {
LAB_0042f85a:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pVVar5 = pObj->pNtk->vGates;
  if (pVVar5->nSize <= iVar14) goto LAB_0042f85a;
  uVar16 = pVVar5->pArray[iVar14];
  if ((ulong)uVar16 == 0xffffffff) {
    local_68 = (SC_Cell *)0x0;
  }
  else {
    if (((int)uVar16 < 0) ||
       (pvVar6 = pObj->pNtk->pSCLib, *(int *)((long)pvVar6 + 100) <= (int)uVar16))
    goto LAB_0042f7de;
    local_68 = *(SC_Cell **)(*(long *)((long)pvVar6 + 0x68) + (ulong)uVar16 * 8);
  }
  p->vTimes2->nSize = 0;
  if (0 < vNodes->nSize) {
    lVar17 = 0;
    do {
      iVar14 = vNodes->pArray[lVar17];
      if (((long)iVar14 < 0) || (pVVar7 = p->pNtk->vObjs, pVVar7->nSize <= iVar14))
      goto LAB_0042f7de;
      pvVar6 = pVVar7->pArray[iVar14];
      if (pvVar6 != (void *)0x0) {
        pVVar8 = p->vTimes2;
        fVar22 = p->pTimes[*(uint *)((long)pvVar6 + 0x10)].rise;
        uVar16 = pVVar8->nCap;
        if (pVVar8->nSize == uVar16) {
          if ((int)uVar16 < 0x10) {
            if (pVVar8->pArray == (float *)0x0) {
              pfVar15 = (float *)malloc(0x40);
            }
            else {
              pfVar15 = (float *)realloc(pVVar8->pArray,0x40);
            }
            pVVar8->pArray = pfVar15;
            iVar14 = 0x10;
          }
          else {
            iVar14 = uVar16 * 2;
            if (iVar14 <= (int)uVar16) goto LAB_0042eca8;
            if (pVVar8->pArray == (float *)0x0) {
              pfVar15 = (float *)malloc((ulong)uVar16 << 3);
            }
            else {
              pfVar15 = (float *)realloc(pVVar8->pArray,(ulong)uVar16 << 3);
            }
            pVVar8->pArray = pfVar15;
          }
          pVVar8->nCap = iVar14;
        }
LAB_0042eca8:
        iVar14 = pVVar8->nSize;
        pVVar8->nSize = iVar14 + 1;
        pVVar8->pArray[iVar14] = fVar22;
        pVVar8 = p->vTimes2;
        fVar22 = p->pTimes[*(uint *)((long)pvVar6 + 0x10)].fall;
        uVar16 = pVVar8->nCap;
        if (pVVar8->nSize == uVar16) {
          if ((int)uVar16 < 0x10) {
            if (pVVar8->pArray == (float *)0x0) {
              pfVar15 = (float *)malloc(0x40);
            }
            else {
              pfVar15 = (float *)realloc(pVVar8->pArray,0x40);
            }
            pVVar8->pArray = pfVar15;
            iVar14 = 0x10;
          }
          else {
            iVar14 = uVar16 * 2;
            if (iVar14 <= (int)uVar16) goto LAB_0042ed4f;
            if (pVVar8->pArray == (float *)0x0) {
              pfVar15 = (float *)malloc((ulong)uVar16 << 3);
            }
            else {
              pfVar15 = (float *)realloc(pVVar8->pArray,(ulong)uVar16 << 3);
            }
            pVVar8->pArray = pfVar15;
          }
          pVVar8->nCap = iVar14;
        }
LAB_0042ed4f:
        iVar14 = pVVar8->nSize;
        pVVar8->nSize = iVar14 + 1;
        pVVar8->pArray[iVar14] = fVar22;
        pVVar8 = p->vTimes2;
        fVar22 = p->pSlews[*(uint *)((long)pvVar6 + 0x10)].rise;
        uVar16 = pVVar8->nCap;
        if (pVVar8->nSize == uVar16) {
          if ((int)uVar16 < 0x10) {
            if (pVVar8->pArray == (float *)0x0) {
              pfVar15 = (float *)malloc(0x40);
            }
            else {
              pfVar15 = (float *)realloc(pVVar8->pArray,0x40);
            }
            pVVar8->pArray = pfVar15;
            iVar14 = 0x10;
          }
          else {
            iVar14 = uVar16 * 2;
            if (iVar14 <= (int)uVar16) goto LAB_0042edf5;
            if (pVVar8->pArray == (float *)0x0) {
              pfVar15 = (float *)malloc((ulong)uVar16 << 3);
            }
            else {
              pfVar15 = (float *)realloc(pVVar8->pArray,(ulong)uVar16 << 3);
            }
            pVVar8->pArray = pfVar15;
          }
          pVVar8->nCap = iVar14;
        }
LAB_0042edf5:
        iVar14 = pVVar8->nSize;
        pVVar8->nSize = iVar14 + 1;
        pVVar8->pArray[iVar14] = fVar22;
        pVVar8 = p->vTimes2;
        fVar22 = p->pSlews[*(uint *)((long)pvVar6 + 0x10)].fall;
        uVar16 = pVVar8->nCap;
        if (pVVar8->nSize == uVar16) {
          if ((int)uVar16 < 0x10) {
            if (pVVar8->pArray == (float *)0x0) {
              pfVar15 = (float *)malloc(0x40);
            }
            else {
              pfVar15 = (float *)realloc(pVVar8->pArray,0x40);
            }
            pVVar8->pArray = pfVar15;
            iVar14 = 0x10;
          }
          else {
            iVar14 = uVar16 * 2;
            if (iVar14 <= (int)uVar16) goto LAB_0042ee9c;
            if (pVVar8->pArray == (float *)0x0) {
              pfVar15 = (float *)malloc((ulong)uVar16 << 3);
            }
            else {
              pfVar15 = (float *)realloc(pVVar8->pArray,(ulong)uVar16 << 3);
            }
            pVVar8->pArray = pfVar15;
          }
          pVVar8->nCap = iVar14;
        }
LAB_0042ee9c:
        iVar14 = pVVar8->nSize;
        pVVar8->nSize = iVar14 + 1;
        pVVar8->pArray[iVar14] = fVar22;
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < vNodes->nSize);
  }
  p->vTimes3->nSize = 0;
  if (0 < vEvals->nSize) {
    lVar17 = 0;
    do {
      iVar14 = vEvals->pArray[lVar17];
      if (((long)iVar14 < 0) || (pVVar7 = p->pNtk->vObjs, pVVar7->nSize <= iVar14))
      goto LAB_0042f7de;
      pvVar6 = pVVar7->pArray[iVar14];
      if (pvVar6 != (void *)0x0) {
        pVVar8 = p->vTimes3;
        fVar22 = p->pTimes[*(uint *)((long)pvVar6 + 0x10)].rise;
        uVar16 = pVVar8->nCap;
        if (pVVar8->nSize == uVar16) {
          if ((int)uVar16 < 0x10) {
            if (pVVar8->pArray == (float *)0x0) {
              pfVar15 = (float *)malloc(0x40);
            }
            else {
              pfVar15 = (float *)realloc(pVVar8->pArray,0x40);
            }
            pVVar8->pArray = pfVar15;
            iVar14 = 0x10;
          }
          else {
            iVar14 = uVar16 * 2;
            if (iVar14 <= (int)uVar16) goto LAB_0042efaa;
            if (pVVar8->pArray == (float *)0x0) {
              pfVar15 = (float *)malloc((ulong)uVar16 << 3);
            }
            else {
              pfVar15 = (float *)realloc(pVVar8->pArray,(ulong)uVar16 << 3);
            }
            pVVar8->pArray = pfVar15;
          }
          pVVar8->nCap = iVar14;
        }
LAB_0042efaa:
        iVar14 = pVVar8->nSize;
        pVVar8->nSize = iVar14 + 1;
        pVVar8->pArray[iVar14] = fVar22;
        pVVar8 = p->vTimes3;
        fVar22 = p->pTimes[*(uint *)((long)pvVar6 + 0x10)].fall;
        uVar16 = pVVar8->nCap;
        if (pVVar8->nSize == uVar16) {
          if ((int)uVar16 < 0x10) {
            if (pVVar8->pArray == (float *)0x0) {
              pfVar15 = (float *)malloc(0x40);
            }
            else {
              pfVar15 = (float *)realloc(pVVar8->pArray,0x40);
            }
            pVVar8->pArray = pfVar15;
            iVar14 = 0x10;
          }
          else {
            iVar14 = uVar16 * 2;
            if (iVar14 <= (int)uVar16) goto LAB_0042f051;
            if (pVVar8->pArray == (float *)0x0) {
              pfVar15 = (float *)malloc((ulong)uVar16 << 3);
            }
            else {
              pfVar15 = (float *)realloc(pVVar8->pArray,(ulong)uVar16 << 3);
            }
            pVVar8->pArray = pfVar15;
          }
          pVVar8->nCap = iVar14;
        }
LAB_0042f051:
        iVar14 = pVVar8->nSize;
        pVVar8->nSize = iVar14 + 1;
        pVVar8->pArray[iVar14] = fVar22;
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < vEvals->nSize);
  }
  p->vLoads2->nSize = 0;
  if (0 < (pObj->vFanins).nSize) {
    lVar17 = 0;
    do {
      pvVar6 = pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar17]];
      pVVar8 = p->vLoads2;
      fVar22 = p->pLoads[*(uint *)((long)pvVar6 + 0x10)].rise;
      uVar16 = pVVar8->nCap;
      if (pVVar8->nSize == uVar16) {
        if ((int)uVar16 < 0x10) {
          if (pVVar8->pArray == (float *)0x0) {
            pfVar15 = (float *)malloc(0x40);
          }
          else {
            pfVar15 = (float *)realloc(pVVar8->pArray,0x40);
          }
          pVVar8->pArray = pfVar15;
          iVar14 = 0x10;
        }
        else {
          iVar14 = uVar16 * 2;
          if (iVar14 <= (int)uVar16) goto LAB_0042f13e;
          if (pVVar8->pArray == (float *)0x0) {
            pfVar15 = (float *)malloc((ulong)uVar16 << 3);
          }
          else {
            pfVar15 = (float *)realloc(pVVar8->pArray,(ulong)uVar16 << 3);
          }
          pVVar8->pArray = pfVar15;
        }
        pVVar8->nCap = iVar14;
      }
LAB_0042f13e:
      iVar14 = pVVar8->nSize;
      pVVar8->nSize = iVar14 + 1;
      pVVar8->pArray[iVar14] = fVar22;
      pVVar8 = p->vLoads2;
      fVar22 = p->pLoads[*(uint *)((long)pvVar6 + 0x10)].fall;
      uVar16 = pVVar8->nCap;
      if (pVVar8->nSize == uVar16) {
        if ((int)uVar16 < 0x10) {
          if (pVVar8->pArray == (float *)0x0) {
            pfVar15 = (float *)malloc(0x40);
          }
          else {
            pfVar15 = (float *)realloc(pVVar8->pArray,0x40);
          }
          pVVar8->pArray = pfVar15;
          iVar14 = 0x10;
        }
        else {
          iVar14 = uVar16 * 2;
          if (iVar14 <= (int)uVar16) goto LAB_0042f1e5;
          if (pVVar8->pArray == (float *)0x0) {
            pfVar15 = (float *)malloc((ulong)uVar16 << 3);
          }
          else {
            pfVar15 = (float *)realloc(pVVar8->pArray,(ulong)uVar16 << 3);
          }
          pVVar8->pArray = pfVar15;
        }
        pVVar8->nCap = iVar14;
      }
LAB_0042f1e5:
      iVar14 = pVVar8->nSize;
      pVVar8->nSize = iVar14 + 1;
      pVVar8->pArray[iVar14] = fVar22;
      lVar17 = lVar17 + 1;
    } while (lVar17 < (pObj->vFanins).nSize);
  }
  local_70 = (float)-DelayGap;
  iVar14 = 0;
  local_6c = 0xffffffff;
  pSVar21 = local_68;
  do {
    if (pSVar21->area < local_68->area) {
      if (Notches < iVar14) break;
      iVar1 = pObj->Id;
      if (((long)iVar1 < 0) || (pVVar5 = pObj->pNtk->vGates, pVVar5->nSize <= iVar1))
      goto LAB_0042f7fd;
      pVVar5->pArray[iVar1] = pSVar21->Id;
      Abc_SclUpdateLoad(p,pObj,local_68,pSVar21);
      Abc_SclTimeCone(p,vNodes);
      iVar1 = pObj->Id;
      if ((long)iVar1 < 0) goto LAB_0042f7fd;
      pAVar9 = pObj->pNtk;
      pVVar5 = pAVar9->vGates;
      if (pVVar5->nSize <= iVar1) goto LAB_0042f7fd;
      pVVar5->pArray[iVar1] = local_68->Id;
      lVar17 = (long)(pObj->vFanins).nSize;
      if (lVar17 < 1) {
        uVar20 = 0;
      }
      else {
        ppvVar10 = pAVar9->vObjs->pArray;
        piVar18 = (pObj->vFanins).pArray;
        pVVar8 = p->vLoads2;
        uVar16 = pVVar8->nSize;
        uVar19 = 0;
        if (0 < (int)uVar16) {
          uVar19 = uVar16;
        }
        if ((int)uVar16 < 2) {
          uVar16 = 0;
        }
        uVar20 = 0;
        do {
          if ((uVar19 + 1 & 0xfffffffe) == uVar20) goto LAB_0042f7bf;
          pfVar15 = pVVar8->pArray;
          pSVar11 = p->pLoads;
          uVar2 = *(uint *)((long)ppvVar10[*(int *)((long)piVar18 + uVar20 * 2)] + 0x10);
          pSVar11[uVar2].rise = pfVar15[uVar20];
          if ((uVar16 & 0x7ffffffe) == uVar20) goto LAB_0042f7bf;
          lVar13 = uVar20 + 1;
          uVar20 = uVar20 + 2;
          pSVar11[uVar2].fall = pfVar15[lVar13];
        } while (lVar17 * 2 != uVar20);
      }
      if (p->vLoads2->nSize != (int)uVar20) {
        __assert_fail("Vec_FltSize(p->vLoads2) == k",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclSize.h"
                      ,0x136,"void Abc_SclLoadRestore(SC_Man *, Abc_Obj_t *)");
      }
      iVar1 = vEvals->nSize;
      if ((long)iVar1 < 1) {
        uVar16 = 0;
        fVar22 = 0.0;
      }
      else {
        pVVar7 = p->pNtk->vObjs;
        fVar22 = 0.0;
        lVar17 = 0;
        uVar16 = 0;
        do {
          iVar3 = vEvals->pArray[lVar17];
          if (((long)iVar3 < 0) || (pVVar7->nSize <= iVar3)) goto LAB_0042f7de;
          pvVar6 = pVVar7->pArray[iVar3];
          if (pvVar6 != (void *)0x0) {
            if ((int)uVar16 < 0) goto LAB_0042f7bf;
            iVar3 = p->vTimes3->nSize;
            if ((iVar3 <= (int)uVar16) || (iVar3 <= (int)(uVar16 + 1))) goto LAB_0042f7bf;
            pfVar15 = p->vTimes3->pArray;
            pSVar11 = p->pTimes;
            uVar19 = *(uint *)((long)pvVar6 + 0x10);
            fVar23 = pfVar15[uVar16] - pSVar11[uVar19].rise;
            if (((p->MaxDelay0 - (pSVar11[uVar19].rise + p->pDepts[uVar19].rise)) + fVar23 < 0.0) ||
               (fVar24 = pfVar15[uVar16 + 1] - pSVar11[uVar19].fall,
               (p->MaxDelay0 - (pSVar11[uVar19].fall + p->pDepts[uVar19].fall)) + fVar24 < 0.0)) {
              fVar22 = -1.0;
              goto LAB_0042f4d4;
            }
            uVar16 = uVar16 + 2;
            fVar22 = fVar22 + fVar23 * 0.5 + fVar24 * 0.5;
          }
          lVar17 = lVar17 + 1;
        } while (iVar1 != lVar17);
      }
      if (p->vTimes3->nSize != uVar16) {
        __assert_fail("Vec_FltSize(p->vTimes3) == k",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclSize.h"
                      ,0x193,"float Abc_SclEvalPerformLegal(SC_Man *, Vec_Int_t *, float)");
      }
      fVar22 = fVar22 / (float)iVar1;
LAB_0042f4d4:
      if (((fVar22 != -1.0) || (NAN(fVar22))) && (local_70 < fVar22)) {
        local_6c = pSVar21->Id;
        local_70 = fVar22;
      }
    }
    pSVar21 = pSVar21->pPrev;
    iVar14 = iVar14 + 1;
  } while (pSVar21 != local_68);
  iVar14 = pObj->Id;
  if ((-1 < (long)iVar14) && (pVVar5 = pObj->pNtk->vGates, iVar14 < pVVar5->nSize)) {
    pVVar5->pArray[iVar14] = local_68->Id;
    iVar14 = vNodes->nSize;
    if ((long)iVar14 < 1) {
      uVar16 = 0;
    }
    else {
      piVar18 = vNodes->pArray;
      pVVar7 = p->pNtk->vObjs;
      lVar17 = 0;
      uVar16 = 0;
      do {
        iVar1 = piVar18[lVar17];
        if (((long)iVar1 < 0) || (pVVar7->nSize <= iVar1)) goto LAB_0042f7de;
        pvVar6 = pVVar7->pArray[iVar1];
        if (pvVar6 != (void *)0x0) {
          if ((int)uVar16 < 0) {
LAB_0042f7bf:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecFlt.h"
                          ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
          }
          iVar1 = p->vTimes2->nSize;
          if (iVar1 <= (int)uVar16) goto LAB_0042f7bf;
          pfVar15 = p->vTimes2->pArray;
          pSVar11 = p->pTimes;
          uVar19 = *(uint *)((long)pvVar6 + 0x10);
          pSVar11[uVar19].rise = pfVar15[uVar16];
          if (iVar1 <= (int)(uVar16 + 1)) goto LAB_0042f7bf;
          pSVar11[uVar19].fall = pfVar15[uVar16 + 1];
          if (iVar1 <= (int)(uVar16 + 2)) goto LAB_0042f7bf;
          uVar2 = uVar16 + 3;
          pSVar11 = p->pSlews;
          pSVar11[uVar19].rise = pfVar15[uVar16 + 2];
          if (iVar1 <= (int)uVar2) goto LAB_0042f7bf;
          uVar16 = uVar16 + 4;
          pSVar11[uVar19].fall = pfVar15[uVar2];
        }
        lVar17 = lVar17 + 1;
      } while (iVar14 != lVar17);
    }
    if (p->vTimes2->nSize != uVar16) {
      __assert_fail("Vec_FltSize(p->vTimes2) == k",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclSize.h"
                    ,0x16b,"void Abc_SclConeRestore(SC_Man *, Vec_Int_t *)");
    }
    iVar14 = clock_gettime(3,&local_40);
    if (iVar14 < 0) {
      lVar17 = -1;
    }
    else {
      lVar17 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
    }
    p->timeSize = p->timeSize + lVar17 + local_48;
    if ((int)local_6c < 0) {
      iVar14 = 0;
    }
    else {
      if ((p->pLib->vCells).nSize <= (int)local_6c) {
LAB_0042f7de:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar14 = pObj->Id;
      if (((long)iVar14 < 0) || (pVVar5 = pObj->pNtk->vGates, pVVar5->nSize <= iVar14))
      goto LAB_0042f7fd;
      pSVar21 = (SC_Cell *)(p->pLib->vCells).pArray[local_6c];
      piVar18 = pVVar5->pArray;
      piVar18[iVar14] = pSVar21->Id;
      p->SumArea = (pSVar21->area - local_68->area) + p->SumArea;
      if (0 < vNodes->nSize) {
        lVar17 = 0;
        do {
          iVar14 = vNodes->pArray[lVar17];
          if (((long)iVar14 < 0) || (pVVar7 = p->pNtk->vObjs, pVVar7->nSize <= iVar14))
          goto LAB_0042f7de;
          plVar12 = (long *)pVVar7->pArray[iVar14];
          if (plVar12 != (long *)0x0) {
            lVar13 = *plVar12;
            uVar4 = *(undefined4 *)(lVar13 + 0xd8);
            iVar14 = (int)plVar12[2];
            Vec_IntFillExtra((Vec_Int_t *)(lVar13 + 0xe0),iVar14 + 1,(int)piVar18);
            if (((long)iVar14 < 0) || (*(int *)(lVar13 + 0xe4) <= iVar14)) goto LAB_0042f7fd;
            *(undefined4 *)(*(long *)(lVar13 + 0xe8) + (long)iVar14 * 4) = uVar4;
            piVar18 = extraout_RDX;
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 < vNodes->nSize);
      }
      Abc_SclUpdateLoad(p,pObj,local_68,pSVar21);
      Abc_SclTimeIncInsert(p,pObj);
      iVar14 = 1;
    }
    return iVar14;
  }
LAB_0042f7fd:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

int Abc_SclCheckImprovement( SC_Man * p, Abc_Obj_t * pObj, Vec_Int_t * vNodes, Vec_Int_t * vEvals, int Notches, int DelayGap )
{
    Abc_Obj_t * pTemp;
    SC_Cell * pCellOld, * pCellNew;
    float dGain, dGainBest;
    int i, k, gateBest;
    abctime clk;
clk = Abc_Clock();
//    printf( "%d -> %d\n", Vec_IntSize(vNodes), Vec_IntSize(vEvals) );
    // save old gate, timing, fanin load
    pCellOld = Abc_SclObjCell( pObj );
    Abc_SclConeStore( p, vNodes );
    Abc_SclEvalStore( p, vEvals );
    Abc_SclLoadStore( p, pObj );
    // try different gate sizes for this node
    gateBest = -1;
    dGainBest = -DelayGap;
    SC_RingForEachCellRev( pCellOld, pCellNew, i )
    {
        if ( pCellNew->area >= pCellOld->area )
            continue;
        if ( i > Notches )
            break;
        // set new cell
        Abc_SclObjSetCell( pObj, pCellNew );
        Abc_SclUpdateLoad( p, pObj, pCellOld, pCellNew );
        // recompute timing
        Abc_SclTimeCone( p, vNodes );
        // set old cell
        Abc_SclObjSetCell( pObj, pCellOld );
        Abc_SclLoadRestore( p, pObj );
        // evaluate gain
        dGain = Abc_SclEvalPerformLegal( p, vEvals, p->MaxDelay0 );
        if ( dGain == -1 )
            continue;
        // save best gain
        if ( dGainBest < dGain )
        {
            dGainBest = dGain;
            gateBest = pCellNew->Id;
        }
    } 
    // put back old cell and timing
    Abc_SclObjSetCell( pObj, pCellOld );
    Abc_SclConeRestore( p, vNodes );
p->timeSize += Abc_Clock() - clk;
    if ( gateBest >= 0 )
    {
        pCellNew = SC_LibCell( p->pLib, gateBest );
        Abc_SclObjSetCell( pObj, pCellNew );
        p->SumArea += pCellNew->area - pCellOld->area;
//        printf( "%f   %f -> %f\n", pCellNew->area - pCellOld->area, p->SumArea - (pCellNew->area - pCellOld->area), p->SumArea );
//        printf( "%6d  %20s -> %20s  %f -> %f\n", Abc_ObjId(pObj), pCellOld->pName, pCellNew->pName, pCellOld->area, pCellNew->area );
        // mark used nodes with the current trav ID
        Abc_NtkForEachObjVec( vNodes, p->pNtk, pTemp, k )
            Abc_NodeSetTravIdCurrent( pTemp );
        // update load and timing...
        Abc_SclUpdateLoad( p, pObj, pCellOld, pCellNew );
        Abc_SclTimeIncInsert( p, pObj );
        return 1;
    }
    return 0;
}